

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadRhs<double>
               (MPSInput *mps,LPRowSetBase<double> *rset,NameSet *rnames,SPxOut *spxout)

{
  double dVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  char *pcVar5;
  double *pdVar6;
  SPxOut *in_RCX;
  MPSInput *in_RDI;
  MPSInput *pMVar7;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  double val;
  int idx;
  char addname [256];
  char rhsname [256];
  MPSInput *in_stack_fffffffffffffd28;
  MPSInput *pMVar8;
  MPSInput *in_stack_fffffffffffffd30;
  MPSInput *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  MPSInput *in_stack_fffffffffffffd48;
  MPSInput *in_stack_fffffffffffffd50;
  undefined4 local_248;
  Verbosity local_244 [3];
  MPSInput *in_stack_fffffffffffffdc8;
  char local_228 [40];
  char local_128 [264];
  SPxOut *local_20;
  MPSInput *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  memset(local_128,0,0x100);
  memset(local_228,0,0x100);
  do {
    bVar2 = MPSInput::readLine(in_stack_fffffffffffffdc8);
    if (!bVar2) {
LAB_0013c6f5:
      MPSInput::syntaxError(in_stack_fffffffffffffd30);
      return;
    }
    pcVar5 = MPSInput::field0(local_8);
    if (pcVar5 != (char *)0x0) {
      if ((local_20 != (SPxOut *)0x0) && (VVar3 = SPxOut::getVerbosity(local_20), 3 < (int)VVar3)) {
        local_244[2] = SPxOut::getVerbosity(local_20);
        local_244[1] = 4;
        (*local_20->_vptr_SPxOut[2])(local_20,local_244 + 1);
        operator<<((SPxOut *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
        operator<<((SPxOut *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
        operator<<((SPxOut *)in_stack_fffffffffffffd30,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd28);
        (*local_20->_vptr_SPxOut[2])(local_20,local_244 + 2);
      }
      pcVar5 = MPSInput::field0(local_8);
      iVar4 = strcmp(pcVar5,"RANGES");
      if (iVar4 == 0) {
        MPSInput::setSection(local_8,RANGES);
        return;
      }
      pcVar5 = MPSInput::field0(local_8);
      iVar4 = strcmp(pcVar5,"BOUNDS");
      if (iVar4 == 0) {
        MPSInput::setSection(local_8,BOUNDS);
        return;
      }
      pcVar5 = MPSInput::field0(local_8);
      iVar4 = strcmp(pcVar5,"ENDATA");
      if (iVar4 == 0) {
        MPSInput::setSection(local_8,ENDATA);
        return;
      }
      goto LAB_0013c6f5;
    }
    pcVar5 = MPSInput::field2(local_8);
    if (((pcVar5 != (char *)0x0) && (pcVar5 = MPSInput::field3(local_8), pcVar5 == (char *)0x0)) ||
       ((pcVar5 = MPSInput::field4(local_8), pcVar5 != (char *)0x0 &&
        (pcVar5 = MPSInput::field5(local_8), pcVar5 == (char *)0x0)))) {
      MPSInput::insertName(local_8,"_RHS_",false);
    }
    pcVar5 = MPSInput::field1(local_8);
    if (((pcVar5 == (char *)0x0) || (pcVar5 = MPSInput::field2(local_8), pcVar5 == (char *)0x0)) ||
       (pcVar5 = MPSInput::field3(local_8), pcVar5 == (char *)0x0)) goto LAB_0013c6f5;
    if (local_128[0] == '\0') {
      pcVar5 = MPSInput::field1(local_8);
      spxSnprintf(local_128,0x100,"%s",pcVar5);
    }
    pcVar5 = MPSInput::field1(local_8);
    iVar4 = strcmp(local_128,pcVar5);
    if (iVar4 == 0) {
      MPSInput::field2(local_8);
      iVar4 = NameSet::number((NameSet *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30
                             );
      if (iVar4 < 0) {
        MPSInput::field1(local_8);
        MPSInput::field2(local_8);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                   in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                   (char *)in_stack_fffffffffffffd30);
      }
      else {
        pcVar5 = MPSInput::field3(local_8);
        pMVar7 = (MPSInput *)atof(pcVar5);
        pdVar6 = LPRowSetBase<double>::rhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                            (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        dVar1 = *pdVar6;
        pdVar6 = (double *)infinity();
        pMVar8 = pMVar7;
        if (dVar1 < *pdVar6) {
          pdVar6 = LPRowSetBase<double>::rhs_w
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                              (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          *pdVar6 = (double)pMVar7;
        }
        pdVar6 = LPRowSetBase<double>::lhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                            (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        dVar1 = *pdVar6;
        pdVar6 = (double *)infinity();
        in_stack_fffffffffffffdc8 = pMVar8;
        if (-*pdVar6 < dVar1) {
          pdVar6 = LPRowSetBase<double>::lhs_w
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                              (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          *pdVar6 = (double)pMVar8;
        }
      }
      pcVar5 = MPSInput::field5(local_8);
      if (pcVar5 != (char *)0x0) {
        MPSInput::field4(local_8);
        iVar4 = NameSet::number((NameSet *)in_stack_fffffffffffffd38,
                                (char *)in_stack_fffffffffffffd30);
        if (iVar4 < 0) {
          in_stack_fffffffffffffd48 = local_8;
          in_stack_fffffffffffffd50 = (MPSInput *)MPSInput::field1(local_8);
          MPSInput::field4(local_8);
          MPSInput::entryIgnored
                    (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                     (char *)in_stack_fffffffffffffd30);
        }
        else {
          pcVar5 = MPSInput::field5(local_8);
          pMVar7 = (MPSInput *)atof(pcVar5);
          pdVar6 = LPRowSetBase<double>::rhs
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                              (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          in_stack_fffffffffffffd40 = (char *)*pdVar6;
          pdVar6 = (double *)infinity();
          pMVar8 = pMVar7;
          if ((double)in_stack_fffffffffffffd40 < *pdVar6) {
            pdVar6 = LPRowSetBase<double>::rhs_w
                               ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                                (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
            *pdVar6 = (double)pMVar7;
            in_stack_fffffffffffffd38 = pMVar7;
          }
          pdVar6 = LPRowSetBase<double>::lhs
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                              (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          in_stack_fffffffffffffd30 = (MPSInput *)*pdVar6;
          pdVar6 = (double *)infinity();
          in_stack_fffffffffffffdc8 = pMVar8;
          if (-*pdVar6 < (double)in_stack_fffffffffffffd30) {
            pdVar6 = LPRowSetBase<double>::lhs_w
                               ((LPRowSetBase<double> *)in_stack_fffffffffffffd30,
                                (int)((ulong)pMVar8 >> 0x20));
            *pdVar6 = (double)pMVar8;
            in_stack_fffffffffffffd28 = pMVar8;
          }
        }
      }
    }
    else {
      pcVar5 = MPSInput::field1(local_8);
      iVar4 = strcmp(local_228,pcVar5);
      if (iVar4 != 0) {
        pcVar5 = MPSInput::field1(local_8);
        spxSnprintf(local_228,0x100,"%s",pcVar5);
        if ((local_20 != (SPxOut *)0x0) && (VVar3 = SPxOut::getVerbosity(local_20), 4 < (int)VVar3))
        {
          local_244[0] = SPxOut::getVerbosity(local_20);
          local_248 = 5;
          (*local_20->_vptr_SPxOut[2])(local_20,&local_248);
          operator<<((SPxOut *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
          operator<<((SPxOut *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
          operator<<((SPxOut *)in_stack_fffffffffffffd30,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd28);
          (*local_20->_vptr_SPxOut[2])(local_20,local_244);
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadRhs(MPSInput& mps, LPRowSetBase<R>& rset, const NameSet& rnames, SPxOut* spxout)
{
   char rhsname[MPSInput::MAX_LINE_LEN] = { '\0' };
   char addname[MPSInput::MAX_LINE_LEN] = { '\0' };
   int idx;
   R val;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD03 RHS name       : " << rhsname  << std::endl;);

         if(!strcmp(mps.field0(), "RANGES"))
            mps.setSection(MPSInput::RANGES);
         else if(!strcmp(mps.field0(), "BOUNDS"))
            mps.setSection(MPSInput::BOUNDS);
         else if(!strcmp(mps.field0(), "ENDATA"))
            mps.setSection(MPSInput::ENDATA);
         else
            break;

         return;
      }

      if(((mps.field2() != nullptr) && (mps.field3() == nullptr)) || ((mps.field4() != nullptr)
            && (mps.field5() == nullptr)))
         mps.insertName("_RHS_");

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      if(*rhsname == '\0')
         spxSnprintf(rhsname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());

      if(strcmp(rhsname, mps.field1()))
      {
         if(strcmp(addname, mps.field1()))
         {
            assert(strlen(mps.field1()) < MPSInput::MAX_LINE_LEN);
            spxSnprintf(addname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());
            SPX_MSG_INFO3((*spxout), (*spxout) << "IMPSRD07 RHS ignored    : " << addname << std::endl);
         }
      }
      else
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("RHS", mps.field1(), "row", mps.field2());
         else
         {
            val = atof(mps.field3());

            // LE or EQ
            if(rset.rhs(idx) < R(infinity))
               rset.rhs_w(idx) = val;

            // GE or EQ
            if(rset.lhs(idx) > R(-infinity))
               rset.lhs_w(idx) = val;
         }

         if(mps.field5() != nullptr)
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("RHS", mps.field1(), "row", mps.field4());
            else
            {
               val = atof(mps.field5());

               // LE or EQ
               if(rset.rhs(idx) < R(infinity))
                  rset.rhs_w(idx) = val;

               // GE or EQ
               if(rset.lhs(idx) > R(-infinity))
                  rset.lhs_w(idx) = val;
            }
         }
      }
   }

   mps.syntaxError();
}